

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

pdu_aspa *
append_aspa(uint8_t version,uint8_t flags,uint32_t customer_asn,uint32_t *provider_asns,
           size_t provider_count)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  long lVar4;
  pdu_aspa *ppVar5;
  long in_FS_OFFSET;
  ulong local_40;
  size_t i;
  pdu_aspa *aspa;
  size_t pdu_size;
  size_t provider_count_local;
  uint32_t *provider_asns_local;
  uint32_t customer_asn_local;
  uint8_t flags_local;
  uint8_t version_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = provider_count * 4 + 0x10;
  data = (char *)lrtr_realloc(data,data_size + lVar4);
  if (data == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x8c,
                  "struct pdu_aspa *append_aspa(uint8_t, uint8_t, uint32_t, uint32_t *, size_t)");
  }
  ppVar5 = (pdu_aspa *)(data + data_size);
  ppVar5->ver = version;
  ppVar5->type = '\v';
  ppVar5->zero = 0;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,(uint32_t)lVar4);
  ppVar5->len = uVar3;
  ppVar5->flags = flags;
  ppVar5->afi_flags = '\x03';
  uVar2 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,(uint16_t)provider_count);
  ppVar5->provider_count = uVar2;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,customer_asn);
  ppVar5->customer_asn = uVar3;
  for (local_40 = 0; local_40 < provider_count; local_40 = local_40 + 1) {
    uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,provider_asns[local_40]);
    provider_asns[local_40] = uVar3;
  }
  if (provider_asns != (uint32_t *)0x0) {
    memcpy(ppVar5 + 1,provider_asns,provider_count << 2);
  }
  data_size = data_size + lVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ppVar5;
  }
  __stack_chk_fail();
}

Assistant:

static struct pdu_aspa *append_aspa(uint8_t version, uint8_t flags, uint32_t customer_asn, uint32_t provider_asns[],
				    size_t provider_count)
{
	size_t pdu_size = sizeof(struct pdu_aspa) + sizeof(uint32_t) * provider_count;

	data = lrtr_realloc(data, data_size + pdu_size);
	assert(data);

	struct pdu_aspa *aspa = (struct pdu_aspa *)(data + data_size);

	aspa->ver = version;
	aspa->type = ASPA;
	aspa->zero = 0;
	aspa->len = BYTES32(pdu_size);
	aspa->flags = flags;
	aspa->afi_flags = 0x3;
	aspa->provider_count = BYTES16((uint16_t)provider_count);
	aspa->customer_asn = BYTES32(customer_asn);

	for (size_t i = 0; i < provider_count; i++)
		provider_asns[i] = BYTES32(provider_asns[i]);

	if (provider_asns)
		memcpy(aspa->provider_asns, provider_asns, sizeof(uint32_t) * provider_count);

	data_size += pdu_size;

	return aspa;
}